

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdrawhelper.cpp
# Opt level: O1

void blend_color(size_t size,Span *array,void *userData)

{
  uint32_t uVar1;
  Color p_Var2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  size_t sVar6;
  bool bVar7;
  
  bVar7 = true;
  if (*(int *)((long)userData + 0x20) == 1) {
    bVar7 = *(uint *)((long)userData + 0x48) < 0xff000000;
  }
  uVar5 = (ulong)*userData;
  uVar4 = 0;
  if (uVar5 != 1) {
    uVar4 = uVar5;
  }
  if (bVar7) {
    uVar4 = uVar5;
  }
  if (size != 0) {
    uVar1 = *(uint32_t *)((long)userData + 0x48);
    p_Var2 = RenderTable.colorTable._M_elems[uVar4].field_1.color_;
    sVar6 = 0;
    do {
      lVar3 = *(long *)((long)userData + 8);
      (*p_Var2)((uint32_t *)
                (((long)*(int *)((long)userData + 0x38) + (long)array[sVar6].x) *
                 *(long *)(lVar3 + 0x20) +
                ((long)*(int *)((long)userData + 0x3c) + (long)array[sVar6].y) *
                *(long *)(lVar3 + 0x18) + *(long *)(lVar3 + 0x28)),(int)array[sVar6].len,uVar1,
                (uint32_t)array[sVar6].coverage);
      sVar6 = sVar6 + 1;
    } while (size != sVar6);
  }
  return;
}

Assistant:

static void blend_color(size_t size, const VRle::Span *array, void *userData)
{
    VSpanData *data = (VSpanData *)(userData);
    Operator   op = getOperator(data);
    const uint32_t color = data->mSolid;

    for (size_t i = 0 ; i < size; ++i) {
        const auto &span = array[i];
        op.funcSolid(data->buffer(span.x, span.y), span.len, color, span.coverage);
    }
}